

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O3

Vec_Int_t * Saig_ManFindIsoPerm(Aig_Man_t *pAig,int fVerbose)

{
  uint uVar1;
  Aig_Man_t *pAVar2;
  int iVar3;
  Iso_Man_t *p;
  Vec_Int_t *pVVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  timespec ts;
  timespec local_48;
  long local_38;
  
  iVar3 = clock_gettime(3,&local_48);
  lVar6 = 1;
  lVar7 = 1;
  if (-1 < iVar3) {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  iVar3 = clock_gettime(3,&local_48);
  if (-1 < iVar3) {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  p = Iso_ManCreate(pAig);
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->timeFout = p->timeFout + lVar5 + lVar7;
  local_38 = lVar6;
  if (fVerbose == 0) {
    uVar1 = p->nClasses;
  }
  else {
    uVar1 = p->nClasses;
    printf("Total objects =%7d.  Entries =%7d.  Classes =%7d.  Singles =%7d.\n",
           (ulong)(uint)p->nObjs,(ulong)(uint)p->nEntries,(ulong)uVar1,(ulong)(uint)p->nSingles);
  }
  while (uVar1 != 0) {
    while( true ) {
      iVar3 = clock_gettime(3,&local_48);
      if (iVar3 < 0) {
        lVar6 = 1;
      }
      else {
        lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
        lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_48.tv_sec * -1000000;
      }
      Iso_ManAssignAdjacency(p);
      iVar3 = clock_gettime(3,&local_48);
      if (iVar3 < 0) {
        lVar7 = -1;
      }
      else {
        lVar7 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
      }
      p->timeFout = p->timeFout + lVar7 + lVar6;
      iVar3 = clock_gettime(3,&local_48);
      if (iVar3 < 0) {
        lVar6 = 1;
      }
      else {
        lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
        lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_48.tv_sec * -1000000;
      }
      Iso_ManRehashClassNodes(p);
      iVar3 = clock_gettime(3,&local_48);
      if (iVar3 < 0) {
        lVar7 = -1;
      }
      else {
        lVar7 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
      }
      p->timeHash = p->timeHash + lVar7 + lVar6;
      uVar1 = p->nSingles;
      if (fVerbose != 0) {
        printf("Total objects =%7d.  Entries =%7d.  Classes =%7d.  Singles =%7d.\n",
               (ulong)(uint)p->nObjs,(ulong)(uint)p->nEntries,(ulong)(uint)p->nClasses,(ulong)uVar1)
        ;
      }
      if (uVar1 != 0) break;
      if (p->nClasses == 0) goto LAB_0065fac3;
      Iso_ManBreakTies(p,fVerbose);
    }
    uVar1 = p->nClasses;
  }
LAB_0065fac3:
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->timeTotal = lVar6 + local_38;
  pAVar2 = p->pAig;
  if (p->nObjIds != pAVar2->nObjs[6] + pAVar2->nObjs[2] + pAVar2->nObjs[5] + 1) {
    __assert_fail("p->nObjIds == 1+Aig_ManCiNum(p->pAig)+Aig_ManNodeNum(p->pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigIsoSlow.c"
                  ,0x4b9,"Vec_Int_t *Saig_ManFindIsoPerm(Aig_Man_t *, int)");
  }
  pVVar4 = Iso_ManFinalize(p);
  Iso_ManStop(p,fVerbose);
  return pVVar4;
}

Assistant:

Vec_Int_t * Saig_ManFindIsoPerm( Aig_Man_t * pAig, int fVerbose )
{
    int fVeryVerbose = 0;
    Vec_Int_t * vRes;
    Iso_Man_t * p;
    abctime clk = Abc_Clock(), clk2 = Abc_Clock();
    p = Iso_ManCreate( pAig );
    p->timeFout += Abc_Clock() - clk;
    Iso_ManPrintClasses( p, fVerbose, fVeryVerbose );
    while ( p->nClasses )
    {
        // assign adjacency to classes
        clk = Abc_Clock();
        Iso_ManAssignAdjacency( p );
        p->timeFout += Abc_Clock() - clk;
        // rehash the class nodes
        clk = Abc_Clock();
        Iso_ManRehashClassNodes( p );
        p->timeHash += Abc_Clock() - clk;
        Iso_ManPrintClasses( p, fVerbose, fVeryVerbose );
        // force refinement
        while ( p->nSingles == 0 && p->nClasses )
        {
//            Iso_ManPrintClasseSizes( p );
            // assign IDs to the topmost level of classes
            Iso_ManBreakTies( p, fVerbose );
            // assign adjacency to classes
            clk = Abc_Clock();
            Iso_ManAssignAdjacency( p );
            p->timeFout += Abc_Clock() - clk;
            // rehash the class nodes
            clk = Abc_Clock();
            Iso_ManRehashClassNodes( p );
            p->timeHash += Abc_Clock() - clk;
            Iso_ManPrintClasses( p, fVerbose, fVeryVerbose );
        }
    }
    p->timeTotal = Abc_Clock() - clk2;
//    printf( "IDs assigned = %d.  Objects = %d.\n", p->nObjIds, 1+Aig_ManCiNum(p->pAig)+Aig_ManNodeNum(p->pAig) );
    assert( p->nObjIds == 1+Aig_ManCiNum(p->pAig)+Aig_ManNodeNum(p->pAig) );
//    if ( p->nClasses )
//        Iso_ManDumpOneClass( p );
    vRes = Iso_ManFinalize( p );
    Iso_ManStop( p, fVerbose );
    return vRes;
}